

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setType(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Type tp)

{
  SPxOut *pSVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int32_t iVar18;
  cpp_dec_float<100U,_int,_void> *pcVar19;
  char *pcVar20;
  Verbosity old_verbosity;
  undefined1 local_24 [4];
  
  if (this->theType != tp) {
    this->theType = tp;
    pcVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
    uVar3 = (pcVar19->data)._M_elems[1];
    uVar4 = (pcVar19->data)._M_elems[2];
    uVar5 = (pcVar19->data)._M_elems[3];
    uVar6 = (pcVar19->data)._M_elems[4];
    uVar7 = (pcVar19->data)._M_elems[5];
    uVar8 = (pcVar19->data)._M_elems[6];
    uVar9 = (pcVar19->data)._M_elems[7];
    uVar10 = (pcVar19->data)._M_elems[8];
    uVar11 = (pcVar19->data)._M_elems[9];
    uVar12 = (pcVar19->data)._M_elems[10];
    uVar13 = (pcVar19->data)._M_elems[0xb];
    uVar14 = (pcVar19->data)._M_elems[0xc];
    uVar15 = (pcVar19->data)._M_elems[0xd];
    uVar16 = (pcVar19->data)._M_elems[0xe];
    uVar17 = (pcVar19->data)._M_elems[0xf];
    (this->m_nonbasicValue).m_backend.data._M_elems[0] = (pcVar19->data)._M_elems[0];
    (this->m_nonbasicValue).m_backend.data._M_elems[1] = uVar3;
    (this->m_nonbasicValue).m_backend.data._M_elems[2] = uVar4;
    (this->m_nonbasicValue).m_backend.data._M_elems[3] = uVar5;
    (this->m_nonbasicValue).m_backend.data._M_elems[4] = uVar6;
    (this->m_nonbasicValue).m_backend.data._M_elems[5] = uVar7;
    (this->m_nonbasicValue).m_backend.data._M_elems[6] = uVar8;
    (this->m_nonbasicValue).m_backend.data._M_elems[7] = uVar9;
    (this->m_nonbasicValue).m_backend.data._M_elems[8] = uVar10;
    (this->m_nonbasicValue).m_backend.data._M_elems[9] = uVar11;
    (this->m_nonbasicValue).m_backend.data._M_elems[10] = uVar12;
    (this->m_nonbasicValue).m_backend.data._M_elems[0xb] = uVar13;
    (this->m_nonbasicValue).m_backend.data._M_elems[0xc] = uVar14;
    (this->m_nonbasicValue).m_backend.data._M_elems[0xd] = uVar15;
    (this->m_nonbasicValue).m_backend.data._M_elems[0xe] = uVar16;
    (this->m_nonbasicValue).m_backend.data._M_elems[0xf] = uVar17;
    (this->m_nonbasicValue).m_backend.exp = pcVar19->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar19->neg;
    iVar18 = pcVar19->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar19->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar18;
    this->m_nonbasicValueUpToDate = false;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"Switching to ",0xd);
      pcVar20 = "entering";
      if (tp == LEAVE) {
        pcVar20 = "leaving";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],pcVar20,(ulong)(tp != LEAVE) + 7);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," algorithm",10);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_24);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setType(Type tp)
{

   if(theType != tp)
   {
      theType = tp;

      forceRecompNonbasicValue();

      unInit();
#if 0
      else
      {
         if(!matrixIsSetup)
         {
            SPxBasisBase<R>::load(this);
            // SPxBasisBase<R>::load(desc());
            // not needed, because load(this) allready loads descriptor
         }

         factorized = false;
         m_numCycle = 0;
#endif
         SPX_MSG_INFO3((*spxout), (*spxout) << "Switching to "
                       << static_cast<const char*>((tp == LEAVE)
                             ? "leaving" : "entering")
                       << " algorithm" << std::endl;)
      }
   }